

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_cp1(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int fs)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i32 arg4;
  TCGv_i32 pTVar1;
  TCGv_i32 fp0_3;
  TCGv_i32 fp0_2;
  TCGv_i32 helper_tmp_1;
  TCGv_i32 fs_tmp;
  TCGv_i32 helper_tmp;
  TCGv_i32 fp0_1;
  TCGv_i32 fp0;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int fs_local;
  int rt_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  if (opc == 0x44000000) {
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    gen_load_fpr32(ctx,pTVar1,fs);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,ret,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    gen_store_gpr(tcg_ctx_00,ret,rt);
  }
  else if (opc == 0x44200000) {
    gen_load_fpr64(ctx,ret,fs);
    gen_store_gpr(tcg_ctx_00,ret,rt);
  }
  else if (opc == 0x44400000) {
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,fs);
    gen_helper_cfc1(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    gen_store_gpr(tcg_ctx_00,ret,rt);
  }
  else if (opc == 0x44600000) {
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    gen_load_fpr32h(ctx,pTVar1,fs);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,ret,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    gen_store_gpr(tcg_ctx_00,ret,rt);
  }
  else if (opc == 0x44800000) {
    gen_load_gpr(tcg_ctx_00,ret,rt);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,ret);
    gen_store_fpr32(ctx,pTVar1,fs);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
  else if (opc == 0x44a00000) {
    gen_load_gpr(tcg_ctx_00,ret,rt);
    gen_store_fpr64(ctx,ret,fs);
  }
  else if (opc == 0x44c00000) {
    gen_load_gpr(tcg_ctx_00,ret,rt);
    save_cpu_state(ctx,0);
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx_00,fs);
    arg4 = tcg_const_i32_mips64el(tcg_ctx_00,rt);
    gen_helper_ctc1(tcg_ctx_00,tcg_ctx_00->cpu_env,ret,pTVar1,arg4);
    tcg_temp_free_i32(tcg_ctx_00,arg4);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    (ctx->base).is_jmp = DISAS_TARGET_0;
  }
  else if (opc == 0x44e00000) {
    gen_load_gpr(tcg_ctx_00,ret,rt);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,ret);
    gen_store_fpr32h(ctx,pTVar1,fs);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_cp1(DisasContext *ctx, uint32_t opc, int rt, int fs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    switch (opc) {
    case OPC_MFC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_MTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32(ctx, fp0, fs);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_CFC1:
        gen_helper_1e0i(cfc1, t0, fs);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_CTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        save_cpu_state(ctx, 0);
        {
            TCGv_i32 fs_tmp = tcg_const_i32(tcg_ctx, fs);

            gen_helper_0e2i(ctc1, t0, fs_tmp, rt);
            tcg_temp_free_i32(tcg_ctx, fs_tmp);
        }
        /* Stop translation as we may have changed hflags */
        ctx->base.is_jmp = DISAS_STOP;
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMFC1:
        gen_load_fpr64(ctx, t0, fs);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_DMTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        gen_store_fpr64(ctx, t0, fs);
        break;
#endif
    case OPC_MFHC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32h(ctx, fp0, fs);
            tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_MTHC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32h(ctx, fp0, fs);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    default:
        MIPS_INVAL("cp1 move");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

 out:
    tcg_temp_free(tcg_ctx, t0);
}